

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyser.cpp
# Opt level: O1

string * __thiscall
libcellml::Analyser::AnalyserImpl::expression_abi_cxx11_
          (string *__return_storage_ptr__,AnalyserImpl *this,AnalyserEquationAstPtr *ast,
          bool includeHierarchy)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long lVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  long *plVar3;
  undefined8 *puVar4;
  undefined7 in_register_00000009;
  AnalyserEquationAstImpl *pAVar5;
  size_type *psVar6;
  long *plVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  undefined8 uVar10;
  AnalyserEquationAstPtr equationAstParent;
  AnalyserEquationAstPtr equationAstGrandparent;
  AnalyserEquationAstPtr equationAst;
  AnalyserEquationAst local_148;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_140;
  AnalyserEquationAstImpl *local_138;
  _Alloc_hider _Stack_130;
  undefined1 local_128 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_100;
  string local_f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_d0 [2];
  string *local_c0;
  AnalyserEquationAstPtr local_b8;
  string local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  AnalyserImpl *local_40;
  GeneratorProfilePtr *local_38;
  
  local_38 = &this->mGeneratorProfile;
  Generator::equationCode_abi_cxx11_
            ((string *)local_128,(Generator *)ast,(AnalyserEquationAstPtr *)local_38,
             (GeneratorProfilePtr *)CONCAT71(in_register_00000009,includeHierarchy));
  plVar3 = (long *)std::__cxx11::string::replace((ulong)local_128,0,(char *)0x0,0x2b605c);
  pAVar5 = (AnalyserEquationAstImpl *)(plVar3 + 2);
  if ((AnalyserEquationAstImpl *)*plVar3 == pAVar5) {
    local_138 = *(AnalyserEquationAstImpl **)pAVar5;
    _Stack_130._M_p = (pointer)plVar3[3];
    local_148.mPimpl = (AnalyserEquationAstImpl *)&local_138;
  }
  else {
    local_138 = *(AnalyserEquationAstImpl **)pAVar5;
    local_148.mPimpl = (AnalyserEquationAstImpl *)*plVar3;
  }
  p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
  *plVar3 = (long)pAVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_148);
  local_88 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_88;
  psVar6 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar6) {
    lVar2 = plVar3[3];
    local_88->_M_allocated_capacity = *psVar6;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar3;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar6;
  }
  __return_storage_ptr__->_M_string_length = plVar3[1];
  *plVar3 = (long)psVar6;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_148.mPimpl != (AnalyserEquationAstImpl *)&local_138) {
    operator_delete(local_148.mPimpl,(ulong)((long)&local_138->mType + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._0_8_ != &local_118) {
    operator_delete((void *)local_128._0_8_,local_118._M_allocated_capacity + 1);
  }
  if (includeHierarchy) {
    local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (ast->super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi =
         (ast->super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if (local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_b8.
              super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
         _M_refcount._M_pi)->_M_use_count =
             (local_b8.
              super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_c0 = __return_storage_ptr__;
    AnalyserEquationAst::parent((AnalyserEquationAst *)&local_108);
    local_40 = this;
    if ((AnalyserEquationAstImpl *)local_108._M_pi == (AnalyserEquationAstImpl *)0x0) {
      local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      a_Stack_d0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      AnalyserEquationAst::parent((AnalyserEquationAst *)&local_d8);
    }
    if ((AnalyserEquationAstImpl *)local_108._M_pi != (AnalyserEquationAstImpl *)0x0) {
      paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)((long)&local_f8 + 0x10);
      do {
        local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)local_108._M_pi;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_b8.
                    super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,&local_100);
        local_108._M_pi = local_d8._M_pi;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&local_100,a_Stack_d0);
        if ((AnalyserEquationAstImpl *)local_108._M_pi == (AnalyserEquationAstImpl *)0x0) {
          local_148.mPimpl = (AnalyserEquationAstImpl *)0x0;
          p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        else {
          AnalyserEquationAst::parent(&local_148);
        }
        this_00._M_pi = a_Stack_d0[0]._M_pi;
        a_Stack_d0[0]._M_pi = p_Stack_140;
        local_d8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148.mPimpl;
        local_148.mPimpl = (AnalyserEquationAstImpl *)0x0;
        p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
        if (p_Stack_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_140);
        }
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60," in","");
        plVar3 = (long *)std::__cxx11::string::append((char *)local_60);
        plVar7 = plVar3 + 2;
        if ((long *)*plVar3 == plVar7) {
          local_70 = *plVar7;
          lStack_68 = plVar3[3];
          local_80 = &local_70;
        }
        else {
          local_70 = *plVar7;
          local_80 = (long *)*plVar3;
        }
        local_78 = plVar3[1];
        *plVar3 = (long)plVar7;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        plVar3 = (long *)std::__cxx11::string::append((char *)&local_80);
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(plVar3 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar3 == paVar8) {
          local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_f8.field_2._8_8_ = plVar3[3];
          local_f8._M_dataplus._M_p = (pointer)paVar9;
        }
        else {
          local_f8.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_f8._M_dataplus._M_p = (pointer)*plVar3;
        }
        local_f8._M_string_length = plVar3[1];
        *plVar3 = (long)paVar8;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        Generator::equationCode_abi_cxx11_
                  (&local_a8,(Generator *)&local_b8,(AnalyserEquationAstPtr *)local_38,
                   (GeneratorProfilePtr *)paVar8);
        uVar10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar9) {
          uVar10 = local_f8.field_2._M_allocated_capacity;
        }
        p_Var1 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)(AnalyserEquationAstImpl **)local_f8._M_string_length +
                 local_a8._M_string_length);
        if ((ulong)uVar10 < p_Var1) {
          uVar10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            uVar10 = local_a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar10 < p_Var1) goto LAB_001c105f;
          puVar4 = (undefined8 *)
                   std::__cxx11::string::replace
                             ((ulong)&local_a8,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
        }
        else {
LAB_001c105f:
          puVar4 = (undefined8 *)
                   std::__cxx11::string::_M_append
                             ((char *)&local_f8,(ulong)local_a8._M_dataplus._M_p);
        }
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(puVar4 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar4 == paVar8) {
          local_118._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_118._8_8_ = puVar4[3];
          local_128._0_8_ = &local_118;
        }
        else {
          local_118._M_allocated_capacity = paVar8->_M_allocated_capacity;
          local_128._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar4;
        }
        local_128._8_8_ = puVar4[1];
        *puVar4 = paVar8;
        puVar4[1] = 0;
        paVar8->_M_local_buf[0] = '\0';
        plVar3 = (long *)std::__cxx11::string::append(local_128);
        pAVar5 = (AnalyserEquationAstImpl *)(plVar3 + 2);
        if ((AnalyserEquationAstImpl *)*plVar3 == pAVar5) {
          local_138 = *(AnalyserEquationAstImpl **)pAVar5;
          _Stack_130._M_p = (pointer)plVar3[3];
          local_148.mPimpl = (AnalyserEquationAstImpl *)&local_138;
        }
        else {
          local_138 = *(AnalyserEquationAstImpl **)pAVar5;
          local_148.mPimpl = (AnalyserEquationAstImpl *)*plVar3;
        }
        p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
        *plVar3 = (long)pAVar5;
        plVar3[1] = 0;
        *(undefined1 *)(plVar3 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_c0,(ulong)local_148.mPimpl);
        if (local_148.mPimpl != (AnalyserEquationAstImpl *)&local_138) {
          operator_delete(local_148.mPimpl,(ulong)((long)&local_138->mType + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._0_8_ != &local_118) {
          operator_delete((void *)local_128._0_8_,local_118._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          (ulong)(local_a8.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f8._M_dataplus._M_p != paVar9) {
          operator_delete(local_f8._M_dataplus._M_p,
                          (ulong)(local_f8.field_2._M_allocated_capacity + 1));
        }
        if (local_80 != &local_70) {
          operator_delete(local_80,local_70 + 1);
        }
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
      } while ((AnalyserEquationAstImpl *)local_108._M_pi != (AnalyserEquationAstImpl *)0x0);
    }
    componentName_abi_cxx11_(&local_f8,local_40,&local_b8);
    __return_storage_ptr__ = local_c0;
    puVar4 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x29d5a2);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(puVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar4 == paVar9) {
      local_118._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_118._8_8_ = puVar4[3];
      local_128._0_8_ = &local_118;
    }
    else {
      local_118._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_128._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*puVar4;
    }
    local_128._8_8_ = puVar4[1];
    *puVar4 = paVar9;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append(local_128);
    pAVar5 = (AnalyserEquationAstImpl *)(plVar3 + 2);
    if ((AnalyserEquationAstImpl *)*plVar3 == pAVar5) {
      local_138 = *(AnalyserEquationAstImpl **)pAVar5;
      _Stack_130._M_p = (pointer)plVar3[3];
      local_148.mPimpl = (AnalyserEquationAstImpl *)&local_138;
    }
    else {
      local_138 = *(AnalyserEquationAstImpl **)pAVar5;
      local_148.mPimpl = (AnalyserEquationAstImpl *)*plVar3;
    }
    p_Stack_140 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[1];
    *plVar3 = (long)pAVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_148.mPimpl);
    if (local_148.mPimpl != (AnalyserEquationAstImpl *)&local_138) {
      operator_delete(local_148.mPimpl,(ulong)((long)&local_138->mType + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._0_8_ != &local_118) {
      operator_delete((void *)local_128._0_8_,local_118._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)((long)&local_f8 + 0x10U)) {
      operator_delete(local_f8._M_dataplus._M_p,(ulong)(local_f8.field_2._M_allocated_capacity + 1))
      ;
    }
    if (a_Stack_d0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_d0[0]._M_pi);
    }
    if (local_100._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_100._M_pi);
    }
    if (local_b8.super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_b8.
                 super___shared_ptr<libcellml::AnalyserEquationAst,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Analyser::AnalyserImpl::expression(const AnalyserEquationAstPtr &ast,
                                               bool includeHierarchy)
{
    // Return the generated code for the given AST, specifying the equation and
    // component in which it is, if needed and requested.

    std::string res = "'" + Generator::equationCode(ast, mGeneratorProfile) + "'";

    if (includeHierarchy) {
        auto equationAst = ast;
        auto equationAstParent = ast->parent();
        auto equationAstGrandparent = (equationAstParent != nullptr) ? equationAstParent->parent() : nullptr;

        while (equationAstParent != nullptr) {
            equationAst = equationAstParent;
            equationAstParent = equationAstGrandparent;
            equationAstGrandparent = (equationAstParent != nullptr) ? equationAstParent->parent() : nullptr;

            res += std::string(" in")
                   + ((equationAstParent == nullptr) ? " equation" : "")
                   + " '" + Generator::equationCode(equationAst, mGeneratorProfile) + "'";
        }

        res += " in component '" + componentName(equationAst) + "'";
    }

    return res;
}